

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::CFIReaderImpl::parseElement(CFIReaderImpl *this)

{
  byte *pbVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  byte bVar3;
  size_type sVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  string *psVar7;
  QName *pQVar8;
  DeadlyImportError *pDVar9;
  uint uVar10;
  value_type *__x;
  allocator<char> local_141;
  value_type *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
  *local_108;
  Attribute attr;
  undefined1 local_70 [64];
  
  local_108 = &this->attributes;
  std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
  clear(local_108);
  bVar3 = *this->dataP;
  uVar10 = (uint)bVar3;
  if ((bVar3 & 0x3f) == 0x38) {
    local_140 = (value_type *)CONCAT44(local_140._4_4_,(uint)bVar3);
    pbVar6 = this->dataP + 1;
    this->dataP = pbVar6;
    local_130 = (vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                 *)&(this->vocabulary).prefixTable;
    local_138 = &(this->vocabulary).namespaceNameTable;
    psVar2 = &attr.qname.uri;
    while (0 < (long)this->dataEnd - (long)pbVar6) {
      pbVar1 = pbVar6 + 1;
      this->dataP = pbVar1;
      bVar3 = *pbVar6;
      if (bVar3 == 0xf0) {
        if ((0 < (long)this->dataEnd - (long)pbVar1) && (uVar10 = (uint)local_140, *pbVar1 < 0x40))
        goto LAB_005603d0;
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        goto LAB_00560662;
      }
      if ((bVar3 & 0xfc) != 0xcc) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        goto LAB_00560662;
      }
      Attribute::Attribute(&attr);
      std::__cxx11::string::assign((char *)&attr);
      if ((bVar3 & 2) == 0) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        local_128._M_string_length = 0;
        local_128.field_2._M_local_buf[0] = '\0';
      }
      else {
        psVar7 = parseIdentifyingStringOrIndex
                           (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_130);
        std::__cxx11::string::string((string *)&local_128,(string *)psVar7);
      }
      std::__cxx11::string::_M_assign((string *)&attr.qname.name);
      std::__cxx11::string::~string((string *)&local_128);
      if ((bVar3 & 1) == 0) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        local_128._M_string_length = 0;
        local_128.field_2._M_local_buf[0] = '\0';
      }
      else {
        psVar7 = parseIdentifyingStringOrIndex(this,local_138);
        std::__cxx11::string::string((string *)&local_128,(string *)psVar7);
      }
      std::__cxx11::string::_M_assign((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_128);
      if (attr.qname.name._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"xmlns",&local_141);
      }
      else {
        std::operator+(&local_128,"xmlns:",&attr.qname.name);
      }
      std::__cxx11::string::operator=((string *)&attr.name,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::string((string *)&local_128,(string *)psVar2);
      FIStringValue::create((string *)local_70);
      std::__shared_ptr<Assimp::FIValue_const,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Assimp::FIValue_const,(__gnu_cxx::_Lock_policy)2> *)&attr.value,
                 (__shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2> *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      std::__cxx11::string::~string((string *)&local_128);
      std::
      vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
      push_back(local_108,&attr);
      Attribute::~Attribute(&attr);
      pbVar6 = this->dataP;
    }
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
LAB_00560662:
    __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_005603d0:
  pQVar8 = parseQualifiedNameOrIndex3(this,&(this->vocabulary).elementNameTable);
  sVar4 = (pQVar8->prefix)._M_string_length;
  if (sVar4 == 0) {
    std::__cxx11::string::string((string *)&attr,(string *)&pQVar8->name);
  }
  else {
    std::operator+(&local_128,&pQVar8->prefix,':');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr,
                   &local_128,&pQVar8->name);
  }
  __x = &this->nodeName;
  std::__cxx11::string::_M_assign((string *)__x);
  std::__cxx11::string::~string((string *)&attr);
  if (sVar4 != 0) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  if ((uVar10 & 0x40) != 0) {
    local_130 = &(this->vocabulary).attributeNameTable;
    local_138 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->vocabulary).attributeValueTable;
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x20);
    local_140 = __x;
    while (pbVar6 = this->dataP, 0 < (long)this->dataEnd - (long)pbVar6) {
      bVar3 = *pbVar6;
      if ((char)bVar3 < '\0') {
        if (0xef < bVar3) {
          this->emptyElement = bVar3 == 0xff;
          this->dataP = pbVar6 + 1;
          __x = local_140;
          if (bVar3 == 0xff) goto LAB_005605f7;
          goto LAB_005605e8;
        }
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        goto LAB_00560662;
      }
      Attribute::Attribute(&attr);
      pQVar8 = parseQualifiedNameOrIndex2(this,local_130);
      QName::operator=(&attr.qname,pQVar8);
      sVar4 = attr.qname.prefix._M_string_length;
      if (attr.qname.prefix._M_string_length == 0) {
        std::__cxx11::string::string((string *)local_70,(string *)&attr.qname.name);
      }
      else {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr,
                       ':');
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,__return_storage_ptr__,&attr.qname.name);
      }
      std::__cxx11::string::operator=((string *)&attr.name,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      if (sVar4 != 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      parseNonIdentifyingStringOrIndex1
                ((CFIReaderImpl *)local_70,
                 (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                  *)this);
      std::__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&attr.value.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      std::
      vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
      push_back(local_108,&attr);
      Attribute::~Attribute(&attr);
    }
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
    goto LAB_00560662;
  }
  puVar5 = this->dataP;
  if ((long)this->dataEnd - (long)puVar5 < 1) {
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
    goto LAB_00560662;
  }
  if (*puVar5 != 0xf0) {
    if (*puVar5 != 0xff) {
      this->emptyElement = false;
LAB_005605e8:
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->elementStack).c,__x);
      goto LAB_005605f7;
    }
    this->terminatorPending = true;
  }
  this->emptyElement = true;
  this->dataP = puVar5 + 1;
LAB_005605f7:
  this->currentNodeType = EXN_ELEMENT;
  return;
}

Assistant:

void parseElement() {
        // C.3

        attributes.clear();

        uint8_t b = *dataP;
        bool hasAttributes = (b & 0x40) != 0; // C.3.3
        if ((b & 0x3f) == 0x38) { // C.3.4.1
            // Parse namespaces
            ++dataP;
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP++;
                if (b == 0xf0) { // C.3.4.3
                    break;
                }
                if ((b & 0xfc) != 0xcc) { // C.3.4.2
                    throw DeadlyImportError(parseErrorMessage);
                }
                // C.12
                Attribute attr;
                attr.qname.prefix = "xmlns";
                attr.qname.name = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
                attr.qname.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
                attr.name = attr.qname.name.empty() ? "xmlns" : "xmlns:" + attr.qname.name;
                attr.value = FIStringValue::create(std::string(attr.qname.uri));
                attributes.push_back(attr);
            }
            if ((dataEnd - dataP < 1) || (*dataP & 0xc0)) {
                throw DeadlyImportError(parseErrorMessage);
            }
        }

        // Parse Element name (C.3.5)
        const QName &elemName = parseQualifiedNameOrIndex3(vocabulary.elementNameTable);
        nodeName = elemName.prefix.empty() ? elemName.name : elemName.prefix + ':' + elemName.name;

        if (hasAttributes) {
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP;
                if (b < 0x80) { // C.3.6.1
                    // C.4
                    Attribute attr;
                    attr.qname = parseQualifiedNameOrIndex2(vocabulary.attributeNameTable);
                    attr.name = attr.qname.prefix.empty() ? attr.qname.name : attr.qname.prefix + ':' + attr.qname.name;
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    attr.value = parseNonIdentifyingStringOrIndex1(vocabulary.attributeValueTable);
                    attributes.push_back(attr);
                }
                else {
                    if ((b & 0xf0) != 0xf0) { // C.3.6.2
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    emptyElement = b == 0xff; // C.3.6.2, C.3.8
                    ++dataP;
                    break;
                }
            }
        }
        else {
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            b = *dataP;
            switch (b) {
            case 0xff:
                terminatorPending = true;
                // Intentionally fall through
            case 0xf0:
                emptyElement = true;
                ++dataP;
                break;
            default:
                emptyElement = false;
            }
        }
        if (!emptyElement) {
            elementStack.push(nodeName);
        }

        currentNodeType = irr::io::EXN_ELEMENT;
    }